

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::eval_rightShiftVecScalar_uvec3(ShaderEvalContext *c)

{
  VecAccess<float,_4,_3> local_68;
  float local_50;
  undefined8 local_4c;
  Vector<float,_3> local_44;
  _anonymous_namespace_ local_38 [12];
  Vector<float,_3> local_2c;
  
  local_50 = c->in[0].m_data[2];
  local_4c = *(undefined8 *)c->in[0].m_data;
  tcu::Vector<float,_3>::cast<unsigned_int>(&local_44);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&local_68,(int)c->in[1].m_data[0]);
  sr::(anonymous_namespace)::rightShift<unsigned_int,3>
            (local_38,(Vector<unsigned_int,_3> *)&local_44,(Vector<int,_3> *)&local_68);
  tcu::Vector<unsigned_int,_3>::cast<float>((Vector<unsigned_int,_3> *)&local_2c);
  local_68.m_vector = &c->color;
  local_68.m_index[0] = 0;
  local_68.m_index[1] = 1;
  local_68.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_68,&local_2c);
  return;
}

Assistant:

void eval_selection_uvec2	(ShaderEvalContext& c) { c.color.yz()	= selection(c.in[0].z() > 0.0f,			c.in[1].swizzle(1, 0).asUint(),			c.in[2].swizzle(2, 1).asUint()).asFloat(); }